

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

Xform * __thiscall tinyusdz::Prim::as<tinyusdz::Xform>(Prim *this)

{
  Xform *pXVar1;
  Prim *this_local;
  
  pXVar1 = tinyusdz::value::Value::as<tinyusdz::Xform>(&this->_data,false);
  return pXVar1;
}

Assistant:

const T *as() const {
    // Check if T is Prim type. e.g. Xform, Material, ...
    if ((value::TypeId::TYPE_ID_MODEL_BEGIN <=
         value::TypeTraits<T>::type_id()) &&
        (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id())) {
      return _data.as<T>();
    }

    return nullptr;
  }